

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

void __thiscall
t_d_generator::print_function_signature(t_d_generator *this,ostream *out,t_function *fn)

{
  t_struct *ptVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pptVar4;
  string local_70;
  string local_50;
  
  render_type_name_abi_cxx11_(&local_50,this,fn->returntype_,false);
  poVar3 = std::operator<<(out,(string *)&local_50);
  poVar3 = std::operator<<(poVar3," ");
  suffix_if_reserved(&local_70,&fn->name_);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::operator<<(poVar3,"(");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  ptVar1 = fn->arglist_;
  bVar2 = true;
  for (pptVar4 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    if (!bVar2) {
      std::operator<<(out,", ");
    }
    render_type_name_abi_cxx11_(&local_50,this,(*pptVar4)->type_,true);
    poVar3 = std::operator<<(out,(string *)&local_50);
    poVar3 = std::operator<<(poVar3," ");
    suffix_if_reserved(&local_70,&(*pptVar4)->name_);
    std::operator<<(poVar3,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = false;
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void print_function_signature(ostream& out, t_function* fn) {
    out << render_type_name(fn->get_returntype()) << " " << suffix_if_reserved(fn->get_name()) << "(";

    const vector<t_field*>& fields = fn->get_arglist()->get_members();
    vector<t_field*>::const_iterator f_iter;
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        out << ", ";
      }
      out << render_type_name((*f_iter)->get_type(), true) << " " << suffix_if_reserved((*f_iter)->get_name());
    }

    out << ")";
  }